

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void rnn_parsefile(rnndb *db,char *file_orig)

{
  long lVar1;
  rnndb *db_00;
  int iVar2;
  char *in_RAX;
  char *pcVar3;
  FILE *__stream;
  char **__ptr;
  long lVar4;
  int iVar5;
  xmlNode *node;
  rnnbitset ***ppprVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  uint uVar11;
  char *fname;
  
  fname = in_RAX;
  pcVar3 = getenv("RNN_PATH");
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O2/rnndb-generated:/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/rnndb:/usr/local/share/rnndb"
  ;
  if (pcVar3 != (char *)0x0) {
    pcVar7 = pcVar3;
  }
  __stream = (FILE *)find_in_path(file_orig,pcVar7,&fname);
  if (__stream == (FILE *)0x0) {
    pcVar7 = "%s: couldn\'t find database file. Please set the env var RNN_PATH.\n";
    fname = file_orig;
LAB_001038e7:
    fprintf(_stderr,pcVar7,fname);
    db->estatus = 1;
  }
  else {
    fclose(__stream);
    pcVar7 = fname;
    uVar11 = db->filesnum;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar11) {
      uVar9 = (ulong)uVar11;
    }
    do {
      if (uVar9 == uVar8) {
        iVar2 = db->filesmax;
        __ptr = db->files;
        if (iVar2 <= (int)uVar11) {
          iVar5 = 0x10;
          if (iVar2 != 0) {
            iVar5 = iVar2 * 2;
          }
          db->filesmax = iVar5;
          __ptr = (char **)realloc(__ptr,(long)iVar5 << 3);
          db->files = __ptr;
          uVar11 = db->filesnum;
          pcVar7 = fname;
        }
        db->filesnum = uVar11 + 1;
        __ptr[(int)uVar11] = pcVar7;
        lVar4 = xmlParseFile(fname);
        if (lVar4 != 0) {
          plVar10 = (long *)(lVar4 + 0x18);
          while (lVar1 = *plVar10, lVar1 != 0) {
            if (*(int *)(lVar1 + 8) == 1) {
              pcVar7 = *(char **)(lVar1 + 0x10);
              iVar2 = strcmp(pcVar7,"database");
              if (iVar2 == 0) {
                ppprVar6 = (rnnbitset ***)(lVar1 + 0x18);
                while (db_00 = (rnndb *)*ppprVar6, db_00 != (rnndb *)0x0) {
                  if (((*(int *)&(db_00->copyright).license == 1) &&
                      (pcVar7 = fname, iVar2 = trytop(db,fname,(xmlNode *)db_00), iVar2 == 0)) &&
                     (iVar2 = trydoc(db_00,pcVar7,node), iVar2 == 0)) {
                    fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",fname,
                            (ulong)*(ushort *)&db_00->files,(db_00->copyright).authors);
                    db->estatus = 1;
                  }
                  ppprVar6 = &db_00->bitsets;
                }
              }
              else {
                fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",fname,
                        (ulong)*(ushort *)(lVar1 + 0x70),pcVar7);
                db->estatus = 1;
              }
            }
            plVar10 = (long *)(lVar1 + 0x30);
          }
          xmlFreeDoc(lVar4);
          return;
        }
        pcVar7 = "%s: couldn\'t open database file. Please set the env var RNN_PATH.\n";
        goto LAB_001038e7;
      }
      iVar2 = strcmp(db->files[uVar8],pcVar7);
      uVar8 = uVar8 + 1;
    } while (iVar2 != 0);
    free(pcVar7);
  }
  return;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *fname;
	const char *rnn_path = getenv("RNN_PATH");

	if (!rnn_path)
		rnn_path = RNN_DEF_PATH;

	FILE *file = find_in_path(file_orig, rnn_path, &fname);
	if (!file) {
		fprintf (stderr, "%s: couldn't find database file. Please set the env var RNN_PATH.\n", file_orig);
		db->estatus = 1;
		return;
	}
	fclose(file);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], fname)) {
			free(fname);
			return;
		}
		
	ADDARRAY(db->files, fname);
	xmlDocPtr doc = xmlParseFile(fname);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", fname);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", fname, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, fname, chain) && !trydoc(db, fname, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", fname, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}